

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_reflection_class.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::ReflectionClassGenerator::ReflectionClassGenerator
          (ReflectionClassGenerator *this,FileDescriptor *file,Options *options)

{
  FileDescriptor *descriptor;
  FileDescriptor *descriptor_00;
  string local_70;
  string local_40;
  Options *local_20;
  Options *options_local;
  FileDescriptor *file_local;
  ReflectionClassGenerator *this_local;
  
  local_20 = options;
  options_local = (Options *)file;
  file_local = (FileDescriptor *)this;
  SourceGeneratorBase::SourceGeneratorBase(&this->super_SourceGeneratorBase,file,options);
  (this->super_SourceGeneratorBase)._vptr_SourceGeneratorBase =
       (_func_int **)&PTR__ReflectionClassGenerator_006f5d20;
  this->file_ = (FileDescriptor *)options_local;
  std::__cxx11::string::string((string *)&this->namespace_);
  std::__cxx11::string::string((string *)&this->reflectionClassname_);
  GetFileNamespace_abi_cxx11_(&local_40,(csharp *)options_local,descriptor);
  std::__cxx11::string::operator=((string *)&this->namespace_,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  GetReflectionClassUnqualifiedName_abi_cxx11_(&local_70,(csharp *)options_local,descriptor_00);
  std::__cxx11::string::operator=((string *)&this->reflectionClassname_,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

ReflectionClassGenerator::ReflectionClassGenerator(const FileDescriptor* file,
                                                   const Options* options)
    : SourceGeneratorBase(file, options),
      file_(file) {
  namespace_ = GetFileNamespace(file);
  reflectionClassname_ = GetReflectionClassUnqualifiedName(file);
}